

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManInvertConstraints(Gia_Man_t *pAig)

{
  Gia_Obj_t *pObj;
  int v;
  
  if (pAig->nConstrs != 0) {
    v = 0;
    while ((v < pAig->vCos->nSize - pAig->nRegs &&
           (pObj = Gia_ManCo(pAig,v), pObj != (Gia_Obj_t *)0x0))) {
      if (pAig->vCos->nSize - (pAig->nRegs + pAig->nConstrs) <= v) {
        Gia_ObjFlipFaninC0(pObj);
      }
      v = v + 1;
    }
  }
  return;
}

Assistant:

void Gia_ManInvertConstraints( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    if ( Gia_ManConstrNum(pAig) == 0 )
        return;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( i >= Gia_ManPoNum(pAig) - Gia_ManConstrNum(pAig) )
            Gia_ObjFlipFaninC0( pObj );
}